

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

NodePtr HighsHashTree<int,_HighsImplications::VarBound>::copy_recurse(NodePtr node)

{
  ListNode *pLVar1;
  undefined4 uVar2;
  Type TVar3;
  int numChilds;
  ListLeaf *ptr;
  ListNode *pLVar4;
  InnerLeaf<1> *__src;
  InnerLeaf<1> *ptr_00;
  InnerLeaf<2> *__src_00;
  InnerLeaf<2> *ptr_01;
  InnerLeaf<3> *__src_01;
  InnerLeaf<3> *ptr_02;
  InnerLeaf<4> *__src_02;
  InnerLeaf<4> *ptr_03;
  BranchNode *pBVar5;
  size_t sVar6;
  BranchNode *ptr_04;
  NodePtr NVar7;
  logic_error *plVar8;
  int i;
  BranchNode *newBranch;
  int size;
  BranchNode *branch;
  InnerLeaf<4> *leaf_4;
  InnerLeaf<3> *leaf_3;
  InnerLeaf<2> *leaf_2;
  InnerLeaf<1> *leaf_1;
  ListNode *copyIter;
  ListNode *iter;
  ListLeaf *copyLeaf;
  ListLeaf *leaf;
  int local_7c;
  ListLeaf *local_40;
  ListLeaf *local_38;
  NodePtr in_stack_ffffffffffffffe8;
  NodePtr local_10;
  NodePtr local_8;
  
  TVar3 = NodePtr::getType(&local_10);
  switch(TVar3) {
  case kEmpty:
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar8,"Unexpected node type in empty in hash tree");
    __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  case kListLeaf:
    local_38 = NodePtr::getListLeaf(&local_10);
    ptr = (ListLeaf *)operator_new(0x28);
    memcpy(ptr,local_38,0x28);
    local_40 = ptr;
    do {
      pLVar4 = (ListNode *)operator_new(0x20);
      pLVar1 = (local_38->first).next;
      pLVar4->next = pLVar1->next;
      uVar2 = *(undefined4 *)&(pLVar1->entry).field_0x4;
      (pLVar4->entry).key_ = (pLVar1->entry).key_;
      *(undefined4 *)&(pLVar4->entry).field_0x4 = uVar2;
      (pLVar4->entry).value_.coef = (pLVar1->entry).value_.coef;
      (pLVar4->entry).value_.constant = (pLVar1->entry).value_.constant;
      (local_40->first).next = pLVar4;
      local_38 = (ListLeaf *)(local_38->first).next;
      local_40 = (ListLeaf *)(local_40->first).next;
    } while ((local_38->first).next != (ListNode *)0x0);
    NodePtr::NodePtr(&local_8,ptr);
    break;
  case kInnerLeafSizeClass1:
    __src = NodePtr::getInnerLeafSizeClass1(&local_10);
    ptr_00 = (InnerLeaf<1> *)operator_new(0xd8);
    memcpy(ptr_00,__src,0xd8);
    NodePtr::NodePtr(&local_8,ptr_00);
    break;
  case kInnerLeafSizeClass2:
    __src_00 = NodePtr::getInnerLeafSizeClass2(&local_10);
    ptr_01 = (InnerLeaf<2> *)operator_new(0x2d8);
    memcpy(ptr_01,__src_00,0x2d8);
    NodePtr::NodePtr(&local_8,ptr_01);
    break;
  case kInnerLeafSizeClass3:
    __src_01 = NodePtr::getInnerLeafSizeClass3(&local_10);
    ptr_02 = (InnerLeaf<3> *)operator_new(0x4d8);
    memcpy(ptr_02,__src_01,0x4d8);
    NodePtr::NodePtr(&local_8,ptr_02);
    break;
  case kInnerLeafSizeClass4:
    __src_02 = NodePtr::getInnerLeafSizeClass4(&local_10);
    ptr_03 = (InnerLeaf<4> *)operator_new(0x6d8);
    memcpy(ptr_03,__src_02,0x6d8);
    NodePtr::NodePtr(&local_8,ptr_03);
    break;
  case kBranchNode:
    pBVar5 = NodePtr::getBranchNode(&local_10);
    numChilds = Occupation::num_set((Occupation *)0x5f452a);
    sVar6 = getBranchNodeSize(numChilds);
    ptr_04 = (BranchNode *)operator_new(sVar6);
    (ptr_04->occupation).occupation = (pBVar5->occupation).occupation;
    for (local_7c = 0; local_7c < numChilds; local_7c = local_7c + 1) {
      NVar7 = copy_recurse(in_stack_ffffffffffffffe8);
      ptr_04->child[local_7c].ptrAndType = NVar7.ptrAndType;
    }
    NodePtr::NodePtr(&local_8,ptr_04);
    break;
  default:
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar8,"Unexpected type in hash tree");
    __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (NodePtr)local_8.ptrAndType;
}

Assistant:

static NodePtr copy_recurse(NodePtr node) {
    switch (node.getType()) {
      case kEmpty:
        throw std::logic_error("Unexpected node type in empty in hash tree");
      case kListLeaf: {
        ListLeaf* leaf = node.getListLeaf();

        ListLeaf* copyLeaf = new ListLeaf(*leaf);

        ListNode* iter = &leaf->first;
        ListNode* copyIter = &copyLeaf->first;
        do {
          copyIter->next = new ListNode(*iter->next);
          iter = iter->next;
          copyIter = copyIter->next;
        } while (iter->next != nullptr);

        return copyLeaf;
      }
      case kInnerLeafSizeClass1: {
        InnerLeaf<1>* leaf = node.getInnerLeafSizeClass1();
        return new InnerLeaf<1>(*leaf);
      }
      case kInnerLeafSizeClass2: {
        InnerLeaf<2>* leaf = node.getInnerLeafSizeClass2();
        return new InnerLeaf<2>(*leaf);
      }
      case kInnerLeafSizeClass3: {
        InnerLeaf<3>* leaf = node.getInnerLeafSizeClass3();
        return new InnerLeaf<3>(*leaf);
      }
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = node.getInnerLeafSizeClass4();
        return new InnerLeaf<4>(*leaf);
      }
      case kBranchNode: {
        BranchNode* branch = node.getBranchNode();
        int size = branch->occupation.num_set();
        BranchNode* newBranch =
            (BranchNode*)::operator new(getBranchNodeSize(size));
        newBranch->occupation = branch->occupation;
        for (int i = 0; i < size; ++i)
          newBranch->child[i] = copy_recurse(branch->child[i]);

        return newBranch;
      }
      default:
        throw std::logic_error("Unexpected type in hash tree");
    }
  }